

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

String * __thiscall kj::_::PromiseBase::trace(String *__return_storage_ptr__,PromiseBase *this)

{
  PromiseNode *pPVar1;
  TraceBuilder *params;
  TraceBuilder builder;
  void *space [32];
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 local_128 [256];
  undefined1 local_28 [8];
  
  memset(local_128,0,0x100);
  local_130 = local_28;
  pPVar1 = (this->node).ptr;
  local_140 = local_128;
  local_138 = local_128;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,(kj *)&local_140,0);
  str<kj::_::TraceBuilder&>(__return_storage_ptr__,(kj *)&local_140,params);
  return __return_storage_ptr__;
}

Assistant:

kj::String PromiseBase::trace() {
  void* space[32]{};
  TraceBuilder builder(space);
  node->tracePromise(builder, false);
  return kj::str(builder);
}